

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

void Imf_2_5::offsetInLineBufferTable
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine,int scanline1,
               int scanline2,int linesInLineBuffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsetInLineBuffer)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  unsigned_long uVar4;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (offsetInLineBuffer,
             (long)(bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (offsetInLineBuffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start;
  uVar4 = 0;
  for (uVar3 = (ulong)scanline1; (long)uVar3 <= (long)scanline2; uVar3 = uVar3 + 1) {
    if ((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
             (long)linesInLineBuffer) == 0) {
      uVar4 = 0;
    }
    puVar1[uVar3] = uVar4;
    uVar4 = uVar4 + puVar2[uVar3];
  }
  return;
}

Assistant:

void
offsetInLineBufferTable (const vector<size_t> &bytesPerLine,
                         int scanline1, int scanline2,
                         int linesInLineBuffer,
                         vector<size_t> &offsetInLineBuffer)
{
    offsetInLineBuffer.resize (bytesPerLine.size());

    size_t offset = 0;

    for (int i = scanline1; i <= scanline2; ++i)
    {
        if (i % linesInLineBuffer == 0)
            offset = 0;

        offsetInLineBuffer[i] = offset;
        offset += bytesPerLine[i];
    }
}